

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O3

void ball_anim_method_proc(Am_Object param_1)

{
  int iVar1;
  Am_Value *pAVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pAVar2 = (Am_Value *)Am_Object::Get(0x82e0,100);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  uVar3 = iVar1 + x_offset;
  pAVar2 = (Am_Value *)Am_Object::Get(0x82e0,0x65);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  uVar5 = iVar1 + y_offset;
  if (uVar5 == 0 || SCARRY4(iVar1,y_offset) != (int)uVar5 < 0) {
LAB_00103e74:
    y_offset = -y_offset;
  }
  else {
    pAVar2 = (Am_Value *)Am_Object::Get(0x82c8,0x67);
    iVar1 = Am_Value::operator_cast_to_int(pAVar2);
    if (iVar1 + -0x15 <= (int)uVar5) goto LAB_00103e74;
  }
  if ((int)uVar3 < 0x14) {
    pAVar2 = (Am_Value *)Am_Object::Get(0x82d0,0x65);
    iVar1 = Am_Value::operator_cast_to_int(pAVar2);
    if (iVar1 <= (int)(uVar5 + 10)) {
      pAVar2 = (Am_Value *)Am_Object::Get(0x82d0,0x65);
      iVar1 = Am_Value::operator_cast_to_int(pAVar2);
      if ((int)uVar5 <= iVar1 + 0x32) {
LAB_00103fbf:
        x_offset = -x_offset;
        goto LAB_00103fc5;
      }
    }
    uVar4 = (uint)PLAYER2_SCORE;
    pAVar2 = (Am_Value *)Am_Object::Get(0x82c0,(ulong)uVar4);
    iVar1 = Am_Value::operator_cast_to_int(pAVar2);
    Am_Object::Set(0x82c0,uVar4,(ulong)(iVar1 + 1));
    reset_game();
    player1sturn = false;
  }
  else {
    pAVar2 = (Am_Value *)Am_Object::Get(0x82c8,0x66);
    iVar1 = Am_Value::operator_cast_to_int(pAVar2);
    if ((int)(uVar3 + 0x15) <= iVar1 + -0x14) goto LAB_00103fc5;
    pAVar2 = (Am_Value *)Am_Object::Get(0x82d8,0x65);
    iVar1 = Am_Value::operator_cast_to_int(pAVar2);
    if (iVar1 <= (int)(uVar5 + 10)) {
      pAVar2 = (Am_Value *)Am_Object::Get(0x82d8,0x65);
      iVar1 = Am_Value::operator_cast_to_int(pAVar2);
      if ((int)uVar5 <= iVar1 + 0x32) goto LAB_00103fbf;
    }
    uVar4 = (uint)PLAYER1_SCORE;
    pAVar2 = (Am_Value *)Am_Object::Get(0x82c0,(ulong)uVar4);
    iVar1 = Am_Value::operator_cast_to_int(pAVar2);
    Am_Object::Set(0x82c0,uVar4,(ulong)(iVar1 + 1));
    reset_game();
    player1sturn = true;
  }
LAB_00103fc5:
  Am_Object::Set(0x82e0,100,(ulong)uVar3);
  Am_Object::Set(0x82e0,0x65,(ulong)uVar5);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, ball_anim_method, (Am_Object /*cmd*/))
{
  int new_x = (int)ball.Get(Am_LEFT) + x_offset;
  int new_y = (int)ball.Get(Am_TOP) + y_offset;
  if (new_y <= 0 || new_y >= (int)main_group.Get(Am_HEIGHT) - ball_size) {
    // y bounce
    y_offset = -y_offset;
  }
  if (new_x < paddle_width + 10) {
    if ((new_y + ball_size / 2) < (int)paddle1.Get(Am_TOP) ||
        (new_y + ball_size / 2) > (int)paddle1.Get(Am_TOP) + paddle_height) {
      //player1 loses
      window.Set(PLAYER2_SCORE, (int)window.Get(PLAYER2_SCORE) + 1);
      reset_game();
      player1sturn = false;
    } else { // bounce off paddle1
      x_offset = -x_offset;
    }
  } else if (new_x + ball_size >
             (int)main_group.Get(Am_WIDTH) - paddle_width - 10) {
    if ((new_y + ball_size / 2) < (int)paddle2.Get(Am_TOP) ||
        (new_y + ball_size / 2) > (int)paddle2.Get(Am_TOP) + paddle_height) {
      //player2 loses
      window.Set(PLAYER1_SCORE, (int)window.Get(PLAYER1_SCORE) + 1);
      reset_game();
      player1sturn = true;
    } else { // bounce off paddle2
      x_offset = -x_offset;
    }
  }
  ball.Set(Am_LEFT, new_x);
  ball.Set(Am_TOP, new_y);
}